

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void jsonenc_duration(jsonenc *e,upb_Message *msg,upb_MessageDef *m)

{
  upb_FieldDef *f;
  upb_FieldDef *f_00;
  upb_MessageValue uVar1;
  int iStack_60;
  _Bool negative;
  int local_4c;
  long lStack_48;
  int32_t nanos;
  long local_38;
  int64_t seconds;
  upb_FieldDef *nanos_f;
  upb_FieldDef *seconds_f;
  upb_MessageDef *m_local;
  upb_Message *msg_local;
  jsonenc *e_local;
  
  f = upb_MessageDef_FindFieldByNumber(m,1);
  f_00 = upb_MessageDef_FindFieldByNumber(m,2);
  uVar1 = upb_Message_GetFieldByDef(msg,f);
  lStack_48 = uVar1.int64_val;
  local_38 = lStack_48;
  uVar1 = upb_Message_GetFieldByDef(msg,f_00);
  iStack_60 = uVar1.int32_val;
  local_4c = iStack_60;
  if (((lStack_48 < 0x4979cb9e01) && (-0x4979cb9e01 < lStack_48)) &&
     ((lStack_48 == 0 || ((iStack_60 == 0 || (lStack_48 < 0 == iStack_60 < 0)))))) {
    if (lStack_48 < 0) {
      local_38 = -lStack_48;
    }
    if (iStack_60 < 0) {
      local_4c = -iStack_60;
    }
    jsonenc_putstr(e,"\"");
    if (iStack_60 < 0 || lStack_48 < 0) {
      jsonenc_putstr(e,"-");
    }
    jsonenc_printf(e,"%ld",local_38);
    jsonenc_nanos(e,local_4c);
    jsonenc_putstr(e,"s\"");
    return;
  }
  jsonenc_err(e,"bad duration");
}

Assistant:

static void jsonenc_duration(jsonenc* e, const upb_Message* msg,
                             const upb_MessageDef* m) {
  const upb_FieldDef* seconds_f = upb_MessageDef_FindFieldByNumber(m, 1);
  const upb_FieldDef* nanos_f = upb_MessageDef_FindFieldByNumber(m, 2);
  int64_t seconds = upb_Message_GetFieldByDef(msg, seconds_f).int64_val;
  int32_t nanos = upb_Message_GetFieldByDef(msg, nanos_f).int32_val;
  bool negative = false;

  if (seconds > 315576000000 || seconds < -315576000000 ||
      (seconds != 0 && nanos != 0 && (seconds < 0) != (nanos < 0))) {
    jsonenc_err(e, "bad duration");
  }

  if (seconds < 0) {
    negative = true;
    seconds = -seconds;
  }
  if (nanos < 0) {
    negative = true;
    nanos = -nanos;
  }

  jsonenc_putstr(e, "\"");
  if (negative) {
    jsonenc_putstr(e, "-");
  }
  jsonenc_printf(e, "%" PRId64, seconds);
  jsonenc_nanos(e, nanos);
  jsonenc_putstr(e, "s\"");
}